

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O1

size_t __thiscall celero::TestVector::size(TestVector *this)

{
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
  __mutex;
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_> _Var1
  ;
  long lVar2;
  shared_ptr<celero::Benchmark> *psVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  _Var9;
  long *in_RSI;
  long *plVar10;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  __it_00;
  long *plStack_d0;
  long lStack_c8;
  long alStack_c0 [2];
  pthread_mutex_t *ppStack_b0;
  long *plStack_a8;
  long lStack_a0;
  long alStack_98 [2];
  long *plStack_88;
  long lStack_80;
  long alStack_78 [2];
  long *plStack_68;
  long lStack_60;
  long alStack_58 [2];
  _Head_base<0UL,_celero::TestVector::Impl_*,_false> _Stack_48;
  
  __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  uVar5 = pthread_mutex_lock((pthread_mutex_t *)
                             __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                             _M_head_impl);
  if (uVar5 == 0) {
    _Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
         .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
    lVar8 = *(long *)((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                            _M_head_impl + 0x30);
    lVar2 = *(long *)((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                            _M_head_impl + 0x28);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
    return lVar8 - lVar2 >> 4;
  }
  plVar10 = (long *)(ulong)uVar5;
  std::__throw_system_error(uVar5);
  ppStack_b0 = (pthread_mutex_t *)*plVar10;
  _Stack_48 = __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl;
  iVar6 = pthread_mutex_lock(ppStack_b0);
  if (iVar6 != 0) {
    uVar7 = std::__throw_system_error(iVar6);
    if (plStack_d0 != alStack_c0) {
      operator_delete(plStack_d0,alStack_c0[0] + 1);
    }
    if (plStack_68 != alStack_58) {
      operator_delete(plStack_68,alStack_58[0] + 1);
    }
    if (plStack_88 != alStack_78) {
      operator_delete(plStack_88,alStack_78[0] + 1);
    }
    if (plStack_a8 != alStack_98) {
      operator_delete(plStack_a8,alStack_98[0] + 1);
    }
    pthread_mutex_unlock(ppStack_b0);
    _Unwind_Resume(uVar7);
  }
  __it_00._M_current = *(shared_ptr<celero::Benchmark> **)(*plVar10 + 0x28);
  _Var9._M_current = *(shared_ptr<celero::Benchmark> **)(*plVar10 + 0x30);
  plStack_a8 = alStack_98;
  std::__cxx11::string::_M_construct<char*>((string *)&plStack_a8,*in_RSI,in_RSI[1] + *in_RSI);
  plStack_88 = alStack_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_88,plStack_a8,lStack_a0 + (long)plStack_a8);
  plStack_d0 = alStack_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_d0,plStack_88,lStack_80 + (long)plStack_88);
  plStack_68 = alStack_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_68,plStack_d0,lStack_c8 + (long)plStack_d0);
  if (plStack_d0 != alStack_c0) {
    operator_delete(plStack_d0,alStack_c0[0] + 1);
  }
  plStack_d0 = alStack_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_d0,plStack_68,lStack_60 + (long)plStack_68);
  lVar8 = (long)_Var9._M_current - (long)__it_00._M_current >> 6;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&plStack_d0,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar4) goto LAB_001354b2;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&plStack_d0,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar4) goto LAB_001354b2;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&plStack_d0,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar4) goto LAB_001354b2;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                          *)&plStack_d0,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar4) goto LAB_001354b2;
      __it_00._M_current = __it_00._M_current + 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)_Var9._M_current - (long)__it_00._M_current >> 4;
  if (lVar8 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar8 != 2) {
      __it._M_current = _Var9._M_current;
      if ((lVar8 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                                *)&plStack_d0,__it_00), __it._M_current = __it_00._M_current, bVar4)
         ) goto LAB_001354b2;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                        *)&plStack_d0,__it);
    if (bVar4) goto LAB_001354b2;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                      *)&plStack_d0,__it_00);
  __it._M_current = _Var9._M_current;
  if (bVar4) {
    _Var9._M_current = __it_00._M_current;
    __it._M_current = __it_00._M_current;
  }
LAB_001354b2:
  if (plStack_d0 != alStack_c0) {
    operator_delete(plStack_d0,alStack_c0[0] + 1);
  }
  if (plStack_68 != alStack_58) {
    operator_delete(plStack_68,alStack_58[0] + 1);
  }
  if (plStack_88 != alStack_78) {
    operator_delete(plStack_88,alStack_78[0] + 1);
  }
  if (plStack_a8 != alStack_98) {
    operator_delete(plStack_a8,alStack_98[0] + 1);
  }
  psVar3 = *(shared_ptr<celero::Benchmark> **)(*plVar10 + 0x30);
  pthread_mutex_unlock(ppStack_b0);
  return CONCAT71((int7)((ulong)_Var9._M_current >> 8),__it._M_current != psVar3) & 0xffffffff;
}

Assistant:

size_t TestVector::size() const
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	return this->pimpl->testVector.size();
}